

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::Clear(Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  UTF8EncodingPolicyBase<false>::Clear(&this->super_UTF8EncodingPolicyBase<false>);
  ClearStates(this);
  TemporaryBuffer::Clear(&this->m_tempChBuf);
  TemporaryBuffer::Clear(&this->m_tempChBufSecondary);
  return;
}

Assistant:

void Scanner<EncodingPolicy>::Clear()
{
    EncodingPolicy::Clear();
    ClearStates();
    this->m_tempChBuf.Clear();
    this->m_tempChBufSecondary.Clear();
}